

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.h
# Opt level: O1

void __thiscall
cmXMLWriter::
Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
          (cmXMLWriter *this,string *name,
          time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          *value)

{
  StartElement(this,name);
  PreContent(this);
  std::ostream::_M_insert<long>((long)this->Output);
  EndElement(this);
  return;
}

Assistant:

void Element(std::string const& name, T const& value)
  {
    this->StartElement(name);
    this->Content(value);
    this->EndElement();
  }